

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isonumber.c
# Opt level: O3

int isonumber_to_s64(int64_t *dst,char *iso,uint64_t scaling)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  uint64_t uVar2;
  uint64_t u64;
  uint64_t local_18;
  
  local_18 = CONCAT44(in_register_00000004,in_EAX);
  iVar1 = isonumber_to_u64(&local_18,iso + (*iso == '-'),scaling);
  if (iVar1 == 0) {
    uVar2 = -local_18;
    if (*iso != '-') {
      uVar2 = local_18;
    }
    *dst = uVar2;
  }
  return iVar1;
}

Assistant:

int
isonumber_to_s64(int64_t *dst, const char *iso, uint64_t scaling) {
  const char *ptr;
  int result;
  uint64_t u64;

  ptr = iso;
  if (*iso == '-') {
    ptr++;
  }

  result = isonumber_to_u64(&u64, ptr, scaling);
  if (!result) {
    if (*iso == '-') {
      *dst = -((int64_t)u64);
    }
    else {
      *dst = (int64_t)u64;
    }
  }
  return result;
}